

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O2

void wabt::WriteS64Leb128(Stream *stream,uint64_t value,char *desc)

{
  long lVar1;
  uint8_t data [10];
  byte local_a [10];
  
  lVar1 = 0;
  if ((long)value < 0) {
    while( true ) {
      if ((value & 0x40) != 0 && (long)value >> 7 == 0xffffffffffffffff) break;
      local_a[lVar1] = (byte)value | 0x80;
      lVar1 = lVar1 + 1;
      value = (long)value >> 7;
    }
    value = (uint64_t)((byte)value & 0x7f);
  }
  else {
    for (; 0x3f < value; value = value >> 7) {
      local_a[lVar1] = (byte)value | 0x80;
      lVar1 = lVar1 + 1;
    }
  }
  local_a[lVar1] = (byte)value;
  Stream::WriteData(stream,local_a,lVar1 + 1,desc,No);
  return;
}

Assistant:

void WriteS64Leb128(Stream* stream, uint64_t value, const char* desc) {
  WriteS64Leb128(stream, Bitcast<int64_t>(value), desc);
}